

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Tree.cxx
# Opt level: O0

int __thiscall Fl_Tree::draw_tree(Fl_Tree *this)

{
  Fl_Tree_Item *this_00;
  byte bVar1;
  int iVar2;
  Fl_Boxtype FVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  Fl_Tree_Connector FVar7;
  Fl_Font face;
  Fl_Fontsize fsize;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  Fl_Image *pFVar13;
  Fl_Tree *pFVar14;
  uint local_b0;
  Fl_Tree_Item *local_a8;
  int local_84;
  int sh;
  int sw;
  int sy;
  int sx;
  int scrollsize;
  int ytoofar;
  int ydiff;
  int SY;
  int Ysave;
  int W;
  int Y;
  int X;
  int ch;
  int cw;
  int cy;
  int cx;
  int ret;
  Fl_Tree *this_local;
  
  cy = 0;
  _cx = this;
  fix_scrollbar_order(this);
  iVar2 = Fl_Widget::x((Fl_Widget *)this);
  FVar3 = Fl_Widget::box((Fl_Widget *)this);
  iVar4 = Fl::box_dx(FVar3);
  cw = iVar2 + iVar4;
  iVar2 = Fl_Widget::y((Fl_Widget *)this);
  FVar3 = Fl_Widget::box((Fl_Widget *)this);
  iVar4 = Fl::box_dy(FVar3);
  ch = iVar2 + iVar4;
  iVar2 = Fl_Widget::w((Fl_Widget *)this);
  FVar3 = Fl_Widget::box((Fl_Widget *)this);
  iVar4 = Fl::box_dw(FVar3);
  X = iVar2 - iVar4;
  iVar2 = Fl_Widget::h((Fl_Widget *)this);
  FVar3 = Fl_Widget::box((Fl_Widget *)this);
  iVar4 = Fl::box_dh(FVar3);
  Y = iVar2 - iVar4;
  bVar1 = Fl_Widget::damage((Fl_Widget *)this);
  if ((bVar1 & 0xfe) != 0) {
    Fl_Widget::draw_box((Fl_Widget *)this);
    Fl_Widget::draw_label((Fl_Widget *)this);
  }
  iVar2 = cw;
  if (this->_root != (Fl_Tree_Item *)0x0) {
    iVar5 = Fl_Tree_Prefs::marginleft(&this->_prefs);
    iVar4 = ch;
    W = iVar2 + iVar5;
    iVar2 = Fl_Tree_Prefs::margintop(&this->_prefs);
    uVar6 = Fl_Widget::visible((Fl_Widget *)this->_vscroll);
    if (uVar6 == 0) {
      local_84 = 0;
    }
    else {
      local_84 = Fl_Scrollbar::value(this->_vscroll);
    }
    iVar5 = X;
    Ysave = (iVar4 + iVar2) - local_84;
    iVar2 = Fl_Tree_Prefs::marginleft(&this->_prefs);
    SY = iVar5 - iVar2;
    FVar7 = Fl_Tree_Prefs::connectorstyle(&this->_prefs);
    if (FVar7 == FL_TREE_CONNECTOR_NONE) {
      pFVar13 = Fl_Tree_Prefs::openicon(&this->_prefs);
      iVar2 = Fl_Image::w(pFVar13);
      W = W - iVar2;
      pFVar13 = Fl_Tree_Prefs::openicon(&this->_prefs);
      iVar2 = Fl_Image::w(pFVar13);
      SY = iVar2 + SY;
    }
    iVar2 = Ysave;
    fl_push_clip(cw,ch,X,Y);
    face = Fl_Tree_Prefs::labelfont(&this->_prefs);
    fsize = Fl_Tree_Prefs::labelsize(&this->_prefs);
    fl_font(face,fsize);
    iVar4 = W;
    this_00 = this->_root;
    pFVar14 = (Fl_Tree *)Fl::focus();
    if (pFVar14 == this) {
      local_a8 = this->_item_focus;
    }
    else {
      local_a8 = (Fl_Tree_Item *)0x0;
    }
    Fl_Tree_Item::draw(this_00,iVar4,&Ysave,SY,(Fl_Widget *)this,local_a8,&this->_prefs,1);
    fl_pop_clip();
    iVar4 = Ysave;
    iVar5 = Fl_Tree_Prefs::margintop(&this->_prefs);
    scrollsize = (iVar4 + iVar5) - iVar2;
    iVar4 = (ch + Y) - iVar4;
    if (0 < iVar4) {
      scrollsize = iVar4 + scrollsize;
    }
    if (((iVar2 < ch) || (Y < scrollsize)) ||
       (iVar2 = Fl_Scrollbar::value(this->_vscroll), 1 < iVar2)) {
      Fl_Widget::visible((Fl_Widget *)this->_vscroll);
      if (this->_scrollbar_size == 0) {
        local_b0 = Fl::scrollbar_size();
      }
      else {
        local_b0 = this->_scrollbar_size;
      }
      iVar2 = Fl_Widget::x((Fl_Widget *)this);
      iVar5 = Fl_Widget::w((Fl_Widget *)this);
      FVar3 = Fl_Widget::box((Fl_Widget *)this);
      iVar8 = Fl::box_dx(FVar3);
      iVar9 = Fl_Widget::y((Fl_Widget *)this);
      FVar3 = Fl_Widget::box((Fl_Widget *)this);
      iVar10 = Fl::box_dy(FVar3);
      iVar11 = Fl_Widget::h((Fl_Widget *)this);
      FVar3 = Fl_Widget::box((Fl_Widget *)this);
      iVar12 = Fl::box_dh(FVar3);
      (*(this->_vscroll->super_Fl_Slider).super_Fl_Valuator.super_Fl_Widget._vptr_Fl_Widget[5])();
      (*(this->_vscroll->super_Fl_Slider).super_Fl_Valuator.super_Fl_Widget._vptr_Fl_Widget[4])
                (this->_vscroll,(ulong)(((iVar2 + iVar5) - iVar8) - local_b0),
                 (ulong)(uint)(iVar9 + iVar10),(ulong)local_b0,(ulong)(uint)(iVar11 - iVar12));
      Fl_Slider::slider_size
                (&this->_vscroll->super_Fl_Slider,(double)((float)Y / (float)scrollsize));
      Fl_Valuator::range((Fl_Valuator *)this->_vscroll,0.0,(double)(scrollsize - Y));
      cy = iVar4;
    }
    else {
      Fl_Valuator::value((Fl_Valuator *)this->_vscroll,0.0);
      (*(this->_vscroll->super_Fl_Slider).super_Fl_Valuator.super_Fl_Widget._vptr_Fl_Widget[6])();
      cy = 0;
    }
    Fl_Group::draw_child(&this->super_Fl_Group,(Fl_Widget *)this->_vscroll);
    return cy;
  }
  return 0;
}

Assistant:

int Fl_Tree::draw_tree() {
  int ret = 0;
  fix_scrollbar_order();
  // Let group draw box+label but *NOT* children.
  // We handle drawing children ourselves by calling each item's draw()
  //
  int cx = x() + Fl::box_dx(box());
  int cy = y() + Fl::box_dy(box());
  int cw = w() - Fl::box_dw(box());
  int ch = h() - Fl::box_dh(box());
  {
    // Handle group's bg
    if ( damage() & ~FL_DAMAGE_CHILD) {			// redraw entire widget?
      Fl_Group::draw_box();
      Fl_Group::draw_label();
    }
    if ( ! _root ) return(0);
    // These values are changed during drawing
    // By end, 'Y' will be the lowest point on the tree
    int X = cx + _prefs.marginleft();
    int Y = cy + _prefs.margintop() - (_vscroll->visible() ? _vscroll->value() : 0);
    int W = cw - _prefs.marginleft();			// - _prefs.marginright();
    // Adjust root's X/W if connectors off
    if (_prefs.connectorstyle() == FL_TREE_CONNECTOR_NONE) {
      X -= _prefs.openicon()->w();
      W += _prefs.openicon()->w();
    }
    int Ysave = Y;
    fl_push_clip(cx,cy,cw,ch);
    {
      fl_font(_prefs.labelfont(), _prefs.labelsize());
      _root->draw(X, Y, W, this,
		  (Fl::focus()==this)?_item_focus:0,	// show focus item ONLY if Fl_Tree has focus
		  _prefs);
    }
    fl_pop_clip();
    
    // Show vertical scrollbar?
    {
#if FLTK_ABI_VERSION >= 10301
      // NEW
      int SY = Y + _prefs.marginbottom();
#else /*FLTK_ABI_VERSION*/
      // OLD
      int SY = Y;
#endif /*FLTK_ABI_VERSION*/
      int ydiff = (SY+_prefs.margintop())-Ysave;		// ydiff=size of tree
      int ytoofar = (cy+ch) - SY;				// ytoofar -- if >0, scrolled beyond bottom
      if ( ytoofar > 0 ) ydiff += ytoofar;
      if ( Ysave<cy || ydiff>ch || int(_vscroll->value())>1 ) {
	_vscroll->visible();
	int scrollsize = _scrollbar_size ? _scrollbar_size : Fl::scrollbar_size();
	int sx = x()+w()-Fl::box_dx(box())-scrollsize;
	int sy = y()+Fl::box_dy(box());
	int sw = scrollsize;
	int sh = h()-Fl::box_dh(box());
	_vscroll->show();
	_vscroll->resize(sx,sy,sw,sh);
	_vscroll->slider_size(float(ch)/float(ydiff));
	_vscroll->range(0.0,ydiff-ch);
	ret = ytoofar;
      } else {
	_vscroll->Fl_Slider::value(0);
	_vscroll->hide();
	ret = 0;
      }
    }
  }
  draw_child(*_vscroll);	// draw scroll last
  return(ret);
}